

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O3

aiNode * __thiscall
Assimp::Q3BSPFileImporter::CreateTopology
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,uint materialIdx,
          vector<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_> *rArray,
          aiMesh **pMesh)

{
  size_t __n;
  sQ3BSPFace *pQ3BSPFace;
  undefined1 auVar1 [16];
  size_t numFaces;
  long lVar2;
  aiMesh *pMesh_00;
  pointer ppsVar3;
  ulong *puVar4;
  aiFace *paVar5;
  ulong uVar6;
  aiVector3D *paVar7;
  aiNode *this_00;
  uint *puVar8;
  uint uVar9;
  aiFace *paVar10;
  ulong uVar11;
  size_t numTriangles;
  pointer ppsVar12;
  pointer ppsVar13;
  uint vertIdx;
  uint faceIdx;
  uint local_38 [2];
  
  ppsVar12 = (rArray->
             super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppsVar13 = (rArray->
             super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (ppsVar12 != ppsVar13) {
    uVar11 = 0;
    ppsVar3 = ppsVar12;
    do {
      if (((*ppsVar3)->iType | 2U) == 3) {
        uVar11 = uVar11 + (long)(*ppsVar3)->iNumOfFaceVerts;
      }
      ppsVar3 = ppsVar3 + 1;
    } while (ppsVar3 != ppsVar13);
    if (uVar11 != 0) {
      lVar2 = 0;
      ppsVar3 = ppsVar12;
      do {
        lVar2 = lVar2 + (ulong)(0 < (*ppsVar3)->iNumOfFaceVerts);
        ppsVar3 = ppsVar3 + 1;
      } while (ppsVar3 != ppsVar13);
      uVar6 = 0;
      if (lVar2 == 0) {
        return (aiNode *)0x0;
      }
      pMesh_00 = (aiMesh *)operator_new(0x520);
      pMesh_00->mPrimitiveTypes = 0;
      pMesh_00->mNumVertices = 0;
      pMesh_00->mNumFaces = 0;
      memset(&pMesh_00->mVertices,0,0xcc);
      pMesh_00->mBones = (aiBone **)0x0;
      pMesh_00->mMaterialIndex = 0;
      (pMesh_00->mName).length = 0;
      (pMesh_00->mName).data[0] = '\0';
      memset((pMesh_00->mName).data + 1,0x1b,0x3ff);
      pMesh_00->mNumAnimMeshes = 0;
      pMesh_00->mAnimMeshes = (aiAnimMesh **)0x0;
      pMesh_00->mMethod = 0;
      (pMesh_00->mAABB).mMin.x = 0.0;
      (pMesh_00->mAABB).mMin.y = 0.0;
      (pMesh_00->mAABB).mMin.z = 0.0;
      (pMesh_00->mAABB).mMax.x = 0.0;
      (pMesh_00->mAABB).mMax.y = 0.0;
      (pMesh_00->mAABB).mMax.z = 0.0;
      memset(pMesh_00->mColors,0,0xa0);
      ppsVar3 = ppsVar12;
      do {
        if (*ppsVar3 != (sQ3BSPFace *)0x0) {
          uVar6 = uVar6 + (long)((*ppsVar3)->iNumOfFaceVerts / 3);
        }
        ppsVar3 = ppsVar3 + 1;
      } while (ppsVar3 != ppsVar13);
      pMesh_00->mPrimitiveTypes = 4;
      puVar4 = (ulong *)operator_new__(-(ulong)(uVar6 >> 0x3c != 0) | uVar6 * 0x10 | 8);
      *puVar4 = uVar6;
      paVar5 = (aiFace *)(puVar4 + 1);
      uVar9 = 0;
      if (uVar6 != 0) {
        paVar10 = paVar5;
        do {
          paVar10->mNumIndices = 0;
          paVar10->mIndices = (uint *)0x0;
          paVar10 = paVar10 + 1;
        } while (paVar10 != paVar5 + uVar6);
        uVar9 = (uint)uVar6;
      }
      pMesh_00->mFaces = paVar5;
      pMesh_00->mNumFaces = uVar9;
      pMesh_00->mNumVertices = (uint)uVar11;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar11;
      uVar6 = SUB168(auVar1 * ZEXT816(0xc),0);
      uVar11 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0xc),8) == 0) {
        uVar11 = uVar6;
      }
      paVar7 = (aiVector3D *)operator_new__(uVar11);
      __n = ((uVar6 - 0xc) / 0xc) * 0xc + 0xc;
      memset(paVar7,0,__n);
      pMesh_00->mVertices = paVar7;
      paVar7 = (aiVector3D *)operator_new__(uVar11);
      memset(paVar7,0,__n);
      pMesh_00->mNormals = paVar7;
      paVar7 = (aiVector3D *)operator_new__(uVar11);
      memset(paVar7,0,__n);
      pMesh_00->mTextureCoords[0] = paVar7;
      paVar7 = (aiVector3D *)operator_new__(uVar11);
      memset(paVar7,0,__n);
      pMesh_00->mTextureCoords[1] = paVar7;
      pMesh_00->mMaterialIndex = materialIdx;
      local_38[1] = 0;
      local_38[0] = 0;
      pMesh_00->mNumUVComponents[0] = 2;
      pMesh_00->mNumUVComponents[1] = 2;
      do {
        pQ3BSPFace = *ppsVar12;
        if (pQ3BSPFace == (sQ3BSPFace *)0x0) {
          __assert_fail("__null != pQ3BSPFace",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                        ,0x160,
                        "aiNode *Assimp::Q3BSPFileImporter::CreateTopology(const Q3BSP::Q3BSPModel *, unsigned int, std::vector<sQ3BSPFace *> &, aiMesh **)"
                       );
        }
        if ((0 < pQ3BSPFace->iNumOfFaceVerts) && ((pQ3BSPFace->iType | 2U) == 3)) {
          createTriangleTopology(this,pModel,pQ3BSPFace,pMesh_00,local_38 + 1,local_38);
          ppsVar13 = (rArray->
                     super__Vector_base<Assimp::Q3BSP::sQ3BSPFace_*,_std::allocator<Assimp::Q3BSP::sQ3BSPFace_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
        }
        ppsVar12 = ppsVar12 + 1;
      } while (ppsVar12 != ppsVar13);
      this_00 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this_00);
      this_00->mNumMeshes = 1;
      puVar8 = (uint *)operator_new__(4);
      this_00->mMeshes = puVar8;
      *pMesh = pMesh_00;
      return this_00;
    }
  }
  return (aiNode *)0x0;
}

Assistant:

aiNode *Q3BSPFileImporter::CreateTopology( const Q3BSP::Q3BSPModel *pModel, unsigned int materialIdx,
        std::vector<sQ3BSPFace*> &rArray, aiMesh **pMesh ) {
    size_t numVerts = countData( rArray );
    if ( 0 == numVerts ) {
        return nullptr;
    }

    size_t numFaces = countFaces( rArray );
    if ( 0 == numFaces ) {
        return nullptr;
    }

    aiMesh *mesh = new aiMesh;
    size_t numTriangles = countTriangles( rArray );
    mesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

    mesh->mFaces = new aiFace[ numTriangles ];
    mesh->mNumFaces = static_cast<unsigned int>(numTriangles);

    mesh->mNumVertices = static_cast<unsigned int>(numVerts);
    mesh->mVertices = new aiVector3D[ numVerts ];
    mesh->mNormals =  new aiVector3D[ numVerts ];
    mesh->mTextureCoords[ 0 ] = new aiVector3D[ numVerts ];
    mesh->mTextureCoords[ 1 ] = new aiVector3D[ numVerts ];
    mesh->mMaterialIndex = materialIdx;

    unsigned int faceIdx = 0;
    unsigned int vertIdx = 0;
    mesh->mNumUVComponents[ 0 ] = 2;
    mesh->mNumUVComponents[ 1 ] = 2;
    for ( std::vector<sQ3BSPFace*>::const_iterator it = rArray.begin(); it != rArray.end(); ++it ) {
        Q3BSP::sQ3BSPFace *pQ3BSPFace = *it;
        ai_assert( NULL != pQ3BSPFace );
        if ( nullptr == pQ3BSPFace ) {
            continue;
        }

        if ( pQ3BSPFace->iNumOfFaceVerts > 0 ) {
            if ( pQ3BSPFace->iType == Polygon || pQ3BSPFace->iType == TriangleMesh ) {
                createTriangleTopology( pModel, pQ3BSPFace, mesh, faceIdx, vertIdx );
            }
        }
    }

    aiNode *pNode = new aiNode;
    pNode->mNumMeshes = 1;
    pNode->mMeshes = new unsigned int[ 1 ];
    *pMesh = mesh;

    return pNode;
}